

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::anon_unknown_0::ShaderStorageBufferObjectBase::ValidateWindow4Quads
          (ShaderStorageBufferObjectBase *this,vec3 *lb,vec3 *rb,vec3 *rt,vec3 *lt,int *bad_pixels)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  void *__s;
  long lVar8;
  float *pfVar9;
  int x;
  ulong uVar10;
  ulong uVar11;
  float *pfVar12;
  long lVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  iVar7 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext
            [4])();
  lVar13 = CONCAT44(extraout_var,iVar7);
  bVar3 = *(byte *)(lVar13 + 8);
  bVar4 = *(byte *)(lVar13 + 0xc);
  bVar5 = *(byte *)(lVar13 + 0x10);
  __s = operator_new(120000);
  uVar14 = 0;
  memset(__s,0,120000);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,100,100,0x1907,
             0x1406,__s);
  fVar16 = 1.0 / (float)(1 << (bVar3 & 0x1f));
  fVar17 = 1.0 / (float)(1 << (bVar4 & 0x1f));
  fVar15 = 1.0 / (float)(1 << (bVar5 & 0x1f));
  lVar13 = (long)__s + 0x2f60;
  bVar6 = true;
  uVar10 = 10;
  do {
    uVar11 = 10;
    lVar8 = 0;
    do {
      fVar1 = *(float *)(lVar13 + -8 + lVar8);
      fVar2 = *(float *)(lVar13 + -4 + lVar8);
      if (((fVar16 < ABS(fVar1 - lb->m_data[0])) || (fVar17 < ABS(fVar2 - lb->m_data[1]))) ||
         (fVar15 < ABS(*(float *)(lVar13 + lVar8) - lb->m_data[2]))) {
        anon_unknown_0::Output
                  ("First bad color (%d, %d): %f %f %f\n",(double)fVar1,(double)fVar2,
                   (double)*(float *)(lVar13 + lVar8),uVar11,uVar10 & 0xffffffff);
        uVar14 = uVar14 + 1;
        bVar6 = false;
      }
      lVar8 = lVar8 + 0xc;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (lVar8 != 0x168);
    uVar10 = uVar10 + 1;
    lVar13 = lVar13 + 0x4b0;
  } while (uVar10 != 0x28);
  if (!bVar6) {
    anon_unknown_0::Output("Left-bottom quad checking failed. Bad pixels: %d",(ulong)uVar14);
  }
  lVar13 = (long)__s + 0x31b8;
  uVar10 = 10;
  do {
    uVar11 = 0x3c;
    lVar8 = 0;
    do {
      fVar1 = *(float *)(lVar13 + -8 + lVar8);
      fVar2 = *(float *)(lVar13 + -4 + lVar8);
      if (((fVar16 < ABS(fVar1 - rb->m_data[0])) || (fVar17 < ABS(fVar2 - rb->m_data[1]))) ||
         (fVar15 < ABS(*(float *)(lVar13 + lVar8) - rb->m_data[2]))) {
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",(double)fVar1,(double)fVar2,
                   (double)*(float *)(lVar13 + lVar8),uVar11,uVar10 & 0xffffffff);
        uVar14 = uVar14 + 1;
        bVar6 = false;
      }
      lVar8 = lVar8 + 0xc;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (lVar8 != 0x168);
    uVar10 = uVar10 + 1;
    lVar13 = lVar13 + 0x4b0;
  } while (uVar10 != 0x28);
  if (!bVar6) {
    anon_unknown_0::Output("right-bottom quad checking failed. Bad pixels: %d",(ulong)uVar14);
  }
  lVar13 = (long)__s + 0x11c18;
  uVar10 = 0x3c;
  do {
    uVar11 = 0x3c;
    lVar8 = 0;
    do {
      fVar1 = *(float *)(lVar13 + -8 + lVar8);
      fVar2 = *(float *)(lVar13 + -4 + lVar8);
      if (((fVar16 < ABS(fVar1 - rt->m_data[0])) || (fVar17 < ABS(fVar2 - rt->m_data[1]))) ||
         (fVar15 < ABS(*(float *)(lVar13 + lVar8) - rt->m_data[2]))) {
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",(double)fVar1,(double)fVar2,
                   (double)*(float *)(lVar13 + lVar8),uVar11,uVar10 & 0xffffffff);
        uVar14 = uVar14 + 1;
        bVar6 = false;
      }
      lVar8 = lVar8 + 0xc;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (lVar8 != 0x168);
    uVar10 = uVar10 + 1;
    lVar13 = lVar13 + 0x4b0;
  } while (uVar10 != 0x5a);
  if (!bVar6) {
    anon_unknown_0::Output("right-top quad checking failed. Bad pixels: %d",(ulong)uVar14);
  }
  lVar13 = (long)__s + 0x119c0;
  uVar10 = 0x3c;
  do {
    uVar11 = 10;
    lVar8 = 0;
    do {
      fVar1 = *(float *)(lVar13 + -8 + lVar8);
      fVar2 = *(float *)(lVar13 + -4 + lVar8);
      if (((fVar16 < ABS(fVar1 - lt->m_data[0])) || (fVar17 < ABS(fVar2 - lt->m_data[1]))) ||
         (fVar15 < ABS(*(float *)(lVar13 + lVar8) - lt->m_data[2]))) {
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",(double)fVar1,(double)fVar2,
                   (double)*(float *)(lVar13 + lVar8),uVar11,uVar10 & 0xffffffff);
        uVar14 = uVar14 + 1;
        bVar6 = false;
      }
      lVar8 = lVar8 + 0xc;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (lVar8 != 0x168);
    uVar10 = uVar10 + 1;
    lVar13 = lVar13 + 0x4b0;
  } while (uVar10 != 0x5a);
  if (!bVar6) {
    anon_unknown_0::Output("left-top quad checking failed. Bad pixels: %d",(ulong)uVar14);
  }
  pfVar12 = (float *)((long)__s + 0xe108);
  uVar10 = 0x30;
  do {
    uVar11 = 0;
    pfVar9 = pfVar12;
    do {
      if (((fVar16 < ABS(pfVar9[-2])) || (fVar17 < ABS(pfVar9[-1]))) || (fVar15 < ABS(*pfVar9))) {
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",(double)pfVar9[-2],(double)pfVar9[-1],
                   (double)*pfVar9,uVar11 & 0xffffffff,uVar10 & 0xffffffff);
        uVar14 = uVar14 + 1;
        bVar6 = false;
      }
      uVar11 = uVar11 + 1;
      pfVar9 = pfVar9 + 3;
    } while (uVar11 != 100);
    uVar10 = uVar10 + 1;
    pfVar12 = pfVar12 + 300;
  } while (uVar10 != 0x34);
  if (!bVar6) {
    anon_unknown_0::Output("middle horizontal line checking failed. Bad pixels: %d",(ulong)uVar14);
  }
  lVar13 = (long)__s + 0x248;
  uVar10 = 0;
  do {
    uVar11 = 0x30;
    lVar8 = 0;
    do {
      fVar1 = *(float *)(lVar13 + -8 + lVar8);
      fVar2 = *(float *)(lVar13 + -4 + lVar8);
      if (((fVar16 < ABS(fVar1)) || (fVar17 < ABS(fVar2))) ||
         (fVar15 < ABS(*(float *)(lVar13 + lVar8)))) {
        anon_unknown_0::Output
                  ("Bad color at (%d, %d): %f %f %f\n",(double)fVar1,(double)fVar2,
                   (double)*(float *)(lVar13 + lVar8),uVar11,uVar10 & 0xffffffff);
        uVar14 = uVar14 + 1;
        bVar6 = false;
      }
      lVar8 = lVar8 + 0xc;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (lVar8 != 0x30);
    uVar10 = uVar10 + 1;
    lVar13 = lVar13 + 0x4b0;
  } while (uVar10 != 100);
  if (!bVar6) {
    anon_unknown_0::Output("middle vertical line checking failed. Bad pixels: %d",(ulong)uVar14);
  }
  if (bad_pixels == (int *)0x0) {
    uVar10 = 0;
  }
  else {
    *bad_pixels = uVar14;
    uVar10 = (ulong)uVar14;
  }
  anon_unknown_0::Output("Bad pixels:%d, counted bad:%d\n",uVar10,(ulong)uVar14);
  operator_delete(__s,120000);
  return bVar6;
}

Assistant:

bool ValidateWindow4Quads(const vec3& lb, const vec3& rb, const vec3& rt, const vec3& lt, int* bad_pixels = NULL)
	{
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		const tcu::PixelFormat&  pixelFormat  = renderTarget.getPixelFormat();
		vec4					 g_color_eps  = vec4(
			1.f / static_cast<float>(1 << pixelFormat.redBits), 1.f / static_cast<float>(1 << pixelFormat.greenBits),
			1.f / static_cast<float>(1 << pixelFormat.blueBits), 1.f / static_cast<float>(1 << pixelFormat.alphaBits));

		const int		  width  = 100;
		const int		  height = 100;
		std::vector<vec3> fb(width * height);
		glReadPixels(0, 0, width, height, GL_RGB, GL_FLOAT, &fb[0]);

		bool status = true;
		int  bad	= 0;

		// left-bottom quad
		for (int y = 10; y < height / 2 - 10; ++y)
		{
			for (int x = 10; x < width / 2 - 10; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], lb, g_color_eps))
				{
					Output("First bad color (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("Left-bottom quad checking failed. Bad pixels: %d", bad);
			//return status;
		}
		// right-bottom quad
		for (int y = 10; y < height / 2 - 10; ++y)
		{
			for (int x = width / 2 + 10; x < width - 10; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], rb, g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("right-bottom quad checking failed. Bad pixels: %d", bad);
			//return status;
		}
		// right-top quad
		for (int y = height / 2 + 10; y < height - 10; ++y)
		{
			for (int x = width / 2 + 10; x < width - 10; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], rt, g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("right-top quad checking failed. Bad pixels: %d", bad);
			//return status;
		}
		// left-top quad
		for (int y = height / 2 + 10; y < height - 10; ++y)
		{
			for (int x = 10; x < width / 2 - 10; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], lt, g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("left-top quad checking failed. Bad pixels: %d", bad);
			//return status;
		}
		// middle horizontal line should be black
		for (int y = height / 2 - 2; y < height / 2 + 2; ++y)
		{
			for (int x = 0; x < width; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], vec3(0), g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("middle horizontal line checking failed. Bad pixels: %d", bad);
			//return status;
		}
		// middle vertical line should be black
		for (int y = 0; y < height; ++y)
		{
			for (int x = width / 2 - 2; x < width / 2 + 2; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], vec3(0), g_color_eps))
				{
					Output("Bad color at (%d, %d): %f %f %f\n", x, y, fb[idx][0], fb[idx][1], fb[idx][2]);
					status = false;
					bad++;
				}
			}
		}
		if (!status)
		{
			Output("middle vertical line checking failed. Bad pixels: %d", bad);
			//return status;
		}

		if (bad_pixels)
			*bad_pixels = bad;
		Output("Bad pixels:%d, counted bad:%d\n", bad_pixels == NULL ? 0 : *bad_pixels, bad);
		return status;
	}